

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::eqz(Literal *__return_storage_ptr__,Literal *this)

{
  BasicType BVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x3c6);
  case i32:
    local_30.func.super_IString.str._M_len =
         (ulong)(uint)local_30.func.super_IString.str._M_len._4_4_ << 0x20;
    local_20 = 2;
    eq(__return_storage_ptr__,this,(Literal *)&local_30.func);
    break;
  case i64:
    local_30.i64 = 0;
    local_20 = 3;
    eq(__return_storage_ptr__,this,(Literal *)&local_30.func);
    break;
  case f32:
    local_30.func.super_IString.str._M_len =
         (ulong)(uint)local_30.func.super_IString.str._M_len._4_4_ << 0x20;
    local_20 = 4;
    eq(__return_storage_ptr__,this,(Literal *)&local_30.func);
    break;
  case f64:
    local_30.i64 = 0;
    local_20 = 5;
    eq(__return_storage_ptr__,this,(Literal *)&local_30.func);
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x3c8);
  }
  ~Literal((Literal *)&local_30.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::eqz() const {
  switch (type.getBasic()) {
    case Type::i32:
      return eq(Literal(int32_t(0)));
    case Type::i64:
      return eq(Literal(int64_t(0)));
    case Type::f32:
      return eq(Literal(float(0)));
    case Type::f64:
      return eq(Literal(double(0)));
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}